

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Qiniu_Error
Qiniu_Io_PutStream(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,void *ctx,
                  size_t fsize,rdFunc rdr,Qiniu_Io_PutExtra *extra)

{
  Qiniu_Bool QVar1;
  Qiniu_Error QVar2;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar3;
  undefined4 uStack_74;
  undefined1 local_68 [8];
  Qiniu_Io_form form;
  char *bucketName;
  char *accessKey;
  size_t fsize_local;
  void *ctx_local;
  char *key_local;
  char *uptoken_local;
  Qiniu_Io_PutRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  self_local = (Qiniu_Client *)Qiniu_OK._0_8_;
  err._0_8_ = Qiniu_OK.message;
  bucketName = (char *)0x0;
  form.lastptr = (curl_httppost *)0x0;
  accessKey = (char *)fsize;
  fsize_local = (size_t)ctx;
  ctx_local = key;
  key_local = uptoken;
  uptoken_local = (char *)ret;
  ret_local = (Qiniu_Io_PutRet *)self;
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&bucketName,(char **)&form.lastptr);
  if (QVar1 == 0) {
    self_local = (Qiniu_Client *)0x190;
    err._0_8_ = anon_var_dwarf_8ce2;
  }
  else {
    Qiniu_Io_form_init((Qiniu_Io_form *)local_68,key_local,(char *)ctx_local,&extra);
    if (ctx_local == (void *)0x0) {
      ctx_local = "";
    }
    curl_formadd(local_68,&form,1,"file",0x10,"filename",CONCAT44(uVar3,0x13),fsize_local,6,
                 accessKey,0x11);
    QVar2 = Qiniu_Io_call_with_callback
                      ((Qiniu_Client *)ret_local,bucketName,(char *)form.lastptr,
                       (Qiniu_Io_PutRet *)uptoken_local,(curl_httppost *)local_68,rdr,extra);
    err._0_8_ = QVar2.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_74,QVar2.code);
    Qiniu_Free(bucketName);
    Qiniu_Free(form.lastptr);
  }
  QVar2._0_8_ = (ulong)self_local & 0xffffffff;
  QVar2.message = (char *)err._0_8_;
  return QVar2;
}

Assistant:

Qiniu_Error Qiniu_Io_PutStream(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key,
    void *ctx, size_t fsize, rdFunc rdr,
    Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    const char *accessKey = NULL, *bucketName = NULL;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form form;
    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    if (key == NULL)
    {
        // Use an empty string instead of the NULL pointer to prevent the curl lib from crashing
        // when read it.
        // **NOTICE**: The magic variable $(filename) will be set as empty string.
        key = "";
    }

    // Add 'filename' property to make it like a file upload one
    // Otherwise it may report: CURL_ERROR(18) or "multipart/message too large"
    // See https://curl.haxx.se/libcurl/c/curl_formadd.html#CURLFORMSTREAM
    // FIXED by fengyh 2017-03-22 10:30
    curl_formadd(
        &form.formpost, &form.lastptr,
        CURLFORM_COPYNAME, "file",
        CURLFORM_FILENAME, "filename",
        CURLFORM_STREAM, ctx,
        CURLFORM_CONTENTSLENGTH, fsize,
        CURLFORM_END);

    err = Qiniu_Io_call_with_callback(self, accessKey, bucketName, ret, form.formpost, rdr, extra);
error:
    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}